

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
* gtl::internal_btree::
  btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
  ::init_internal(btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
                  *n,btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
                     *parent)

{
  btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
  **m;
  btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
  *parent_local;
  btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
  *n_local;
  
  init_leaf(n,parent,0xf);
  set_max_count(n,'\0');
  m = mutable_child(n,0);
  absl::container_internal::SanitizerPoisonMemoryRegion(m,0x80);
  return n;
}

Assistant:

static btree_node *init_internal(btree_node *n, btree_node *parent) {
    init_leaf(n, parent, kNodeValues);
    // Set `max_count` to a sentinel value to indicate that this node is
    // internal.
    n->set_max_count(kInternalNodeMaxCount);
    absl::container_internal::SanitizerPoisonMemoryRegion(
        &n->mutable_child(0), (kNodeValues + 1) * sizeof(btree_node *));
    return n;
  }